

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  code *zBuf;
  long lVar1;
  sqlite3_io_methods *psVar2;
  sqlite3_io_methods *psVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  sqlite3_io_methods *p;
  sqlite3_mutex *psVar8;
  uint *puVar9;
  size_t sVar10;
  void *nBytes;
  void *pvVar11;
  ulong uVar12;
  _func_int_sqlite3_file_ptr_sqlite3_int64 *__s;
  int *piVar13;
  ulong uVar14;
  ulong uVar15;
  u64 uVar16;
  undefined4 in_register_00000034;
  int iVar17;
  long lVar18;
  char *pcVar19;
  bool bVar20;
  int x;
  stat sStat;
  int local_dc;
  ulong local_d8;
  undefined8 local_d0;
  sqlite3_io_methods *local_c8;
  undefined1 local_c0 [24];
  uint local_a8;
  uint local_a4;
  uint local_a0;
  long local_90;
  
  local_d0 = CONCAT44(in_register_00000034,iRegion);
  uVar4 = (*aSyscall[0x19].pCurrent)();
  local_d8 = 1;
  if (0x7fff < (int)uVar4) {
    local_d8 = (ulong)(uVar4 >> 0xf);
  }
  if (fd[8].pMethods == (sqlite3_io_methods *)0x0) {
    iVar5 = sqlite3_initialize();
    if (iVar5 == 0) {
      p = (sqlite3_io_methods *)sqlite3Malloc(0x18);
    }
    else {
      p = (sqlite3_io_methods *)0x0;
    }
    if (p == (sqlite3_io_methods *)0x0) {
      iVar5 = 7;
    }
    else {
      *(undefined8 *)p = 0;
      p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
      p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
      if (sqlite3Config.bCoreMutex == 0) {
        psVar8 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
      }
      if (psVar8 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar8);
      }
      psVar2 = fd[2].pMethods;
      __s = psVar2->xTruncate;
      if (__s == (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0) {
        psVar3 = fd[7].pMethods;
        iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
        if (iVar5 == 0) {
          local_c8 = psVar3;
          sVar10 = strlen((char *)psVar3);
          uVar16 = (long)(int)sVar10 + 0x46;
          iVar5 = sqlite3_initialize();
          if (iVar5 == 0) {
            __s = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)sqlite3Malloc(uVar16);
          }
          else {
            __s = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
          }
          iVar5 = 7;
          if (__s == (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0) goto LAB_00124ff2;
          memset(__s,0,uVar16);
          zBuf = __s + 0x40;
          *(code **)(__s + 0x10) = zBuf;
          sqlite3_snprintf((int)sVar10 + 6,(char *)zBuf,"%s-shm",local_c8);
          *(undefined4 *)(__s + 0x18) = 0xffffffff;
          psVar3 = fd[2].pMethods;
          psVar3->xTruncate = __s;
          *(sqlite3_io_methods **)__s = psVar3;
          if (sqlite3Config.bCoreMutex != 0) {
            iVar17 = sqlite3_initialize();
            if (iVar17 == 0) {
              psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(0);
            }
            else {
              psVar8 = (sqlite3_mutex *)0x0;
            }
            *(sqlite3_mutex **)(__s + 8) = psVar8;
            if (psVar8 != (sqlite3_mutex *)0x0) goto LAB_00125356;
            goto LAB_00124ff4;
          }
LAB_00125356:
          if (*(char *)((long)&psVar2->xRead + 5) == '\0') {
            iVar17 = 0;
            iVar5 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
            if (iVar5 == 0) {
              iVar17 = 0x42;
            }
            else {
              __s[0x22] = (code)0x1;
            }
            uVar4 = robust_open((char *)zBuf,iVar17,local_a8 & 0x1ff);
            *(uint *)(__s + 0x18) = uVar4;
            if ((int)uVar4 < 0) {
              bVar20 = false;
              iVar5 = 0xe;
              sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x87ac,
                          "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
              unixLogErrorAtLine(0xe,"open",(char *)zBuf,0x87ac);
            }
            else {
              iVar5 = (*aSyscall[0x15].pCurrent)();
              if (iVar5 == 0) {
                (*aSyscall[0x14].pCurrent)((ulong)uVar4,(ulong)local_a4,(ulong)local_a0);
              }
              iVar5 = unixShmSystemLock((unixFile *)fd,1,0x80,1);
              bVar20 = true;
              if (iVar5 == 0) {
                uVar4 = *(uint *)(__s + 0x18);
                do {
                  iVar5 = (*aSyscall[6].pCurrent)((ulong)uVar4);
                  if (-1 < iVar5) break;
                  piVar13 = __errno_location();
                } while (*piVar13 == 4);
                if (iVar5 == 0) goto LAB_001253ed;
                iVar5 = 0x120a;
                unixLogErrorAtLine(0x120a,"ftruncate",(char *)zBuf,0x87bc);
                bVar20 = false;
              }
              else {
LAB_001253ed:
                iVar5 = 0;
              }
              if (bVar20) {
                iVar5 = unixShmSystemLock((unixFile *)fd,0,0x80,1);
              }
              bVar20 = iVar5 == 0;
            }
          }
          else {
            bVar20 = true;
          }
        }
        else {
          iVar5 = 0x70a;
LAB_00124ff2:
          __s = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
LAB_00124ff4:
          bVar20 = false;
        }
        if (bVar20) goto LAB_00124ffc;
        unixShmPurge((unixFile *)fd);
        sqlite3_free(p);
        if (sqlite3Config.bCoreMutex == 0) {
          psVar8 = (sqlite3_mutex *)0x0;
        }
        else {
          psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
        }
      }
      else {
LAB_00124ffc:
        *(_func_int_sqlite3_file_ptr_sqlite3_int64 **)p = __s;
        *(int *)(__s + 0x30) = *(int *)(__s + 0x30) + 1;
        fd[8].pMethods = p;
        if (sqlite3Config.bCoreMutex == 0) {
          psVar8 = (sqlite3_mutex *)0x0;
        }
        else {
          psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
        }
        if (psVar8 != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar8);
        }
        if (*(sqlite3_mutex **)(__s + 8) != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(__s + 8));
        }
        p->xClose = *(_func_int_sqlite3_file_ptr **)(__s + 0x38);
        *(sqlite3_io_methods **)(__s + 0x38) = p;
        psVar8 = *(sqlite3_mutex **)(__s + 8);
        iVar5 = 0;
      }
      if (psVar8 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar8);
      }
    }
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  lVar1 = *(long *)fd[8].pMethods;
  if (*(sqlite3_mutex **)(lVar1 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar1 + 8));
  }
  iVar17 = (int)local_d8 + (int)local_d0;
  iVar17 = iVar17 - iVar17 % (int)local_d8;
  iVar5 = 0;
  if (iVar17 <= (int)(uint)*(ushort *)(lVar1 + 0x20)) goto LAB_00125274;
  *(int *)(lVar1 + 0x1c) = szRegion;
  iVar5 = 0;
  if (-1 < (int)*(uint *)(lVar1 + 0x18)) {
    iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)(lVar1 + 0x18),local_c0);
    if (iVar5 != 0) {
      iVar5 = 0x130a;
      goto LAB_00125274;
    }
    iVar6 = iVar17 * szRegion;
    iVar5 = 0;
    if (local_90 < iVar6) {
      if (bExtend == 0) {
        iVar5 = 0;
        goto LAB_00125274;
      }
      lVar18 = local_90 + 0xfff;
      if (-1 < local_90) {
        lVar18 = local_90;
      }
      iVar5 = iVar6 + 0xfff;
      if (-1 < iVar6) {
        iVar5 = iVar6;
      }
      iVar6 = (int)(lVar18 >> 0xc);
      if (iVar6 < iVar5 >> 0xc) {
        lVar18 = (long)(iVar5 >> 0xc) - (long)iVar6;
        uVar15 = (long)iVar6 << 0xc | 0xfff;
        iVar5 = 0;
        do {
          local_dc = 0;
          iVar6 = seekAndWriteFd(*(int *)(lVar1 + 0x18),uVar15,"",1,&local_dc);
          bVar20 = false;
          if (iVar6 != 1) {
            pcVar19 = *(char **)(lVar1 + 0x10);
            puVar9 = (uint *)__errno_location();
            if (pcVar19 == (char *)0x0) {
              pcVar19 = "";
            }
            iVar5 = 0x130a;
            sqlite3_log(0x130a,"os_unix.c:%d: (%d) %s(%s) - %s",0x8840,(ulong)*puVar9,"write",
                        pcVar19,"");
            bVar20 = true;
          }
          if (iVar6 != 1) goto LAB_001250f1;
          uVar15 = uVar15 + 0x1000;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
        bVar20 = false;
      }
      else {
        bVar20 = false;
        iVar5 = 0;
      }
LAB_001250f1:
      if (bVar20) goto LAB_00125274;
    }
  }
  pvVar11 = *(void **)(lVar1 + 0x28);
  iVar6 = sqlite3_initialize();
  nBytes = (void *)0x0;
  if (iVar6 == 0) {
    if (0 < iVar17 * 8) {
      nBytes = (void *)(ulong)(uint)(iVar17 * 8);
    }
    nBytes = sqlite3Realloc(pvVar11,(u64)nBytes);
  }
  if (nBytes == (void *)0x0) {
    iVar5 = 0xc0a;
  }
  else {
    *(void **)(lVar1 + 0x28) = nBytes;
    uVar16 = (u64)szRegion;
    iVar6 = (int)local_d8;
    uVar15 = local_d8 & 0xffffffff;
    do {
      if (iVar17 <= (int)(uint)*(ushort *)(lVar1 + 0x20)) break;
      if ((int)*(uint *)(lVar1 + 0x18) < 0) {
        iVar7 = sqlite3_initialize();
        if (iVar7 == 0) {
          pvVar11 = sqlite3Malloc(uVar16);
        }
        else {
          pvVar11 = (void *)0x0;
        }
        if (pvVar11 != (void *)0x0) {
          memset(pvVar11,0,uVar16);
          goto LAB_0012520a;
        }
        iVar5 = 7;
        bVar20 = false;
      }
      else {
        pvVar11 = (void *)(*aSyscall[0x16].pCurrent)
                                    (0,(long)(szRegion * iVar6),
                                     (ulong)((uint)(*(char *)(lVar1 + 0x22) == '\0') * 2 + 1),1,
                                     (ulong)*(uint *)(lVar1 + 0x18),
                                     *(ushort *)(lVar1 + 0x20) * uVar16);
        if (pvVar11 == (void *)0xffffffffffffffff) {
          pcVar19 = *(char **)(lVar1 + 0x10);
          puVar9 = (uint *)__errno_location();
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
          bVar20 = false;
          iVar5 = 0x150a;
          sqlite3_log(0x150a,"os_unix.c:%d: (%d) %s(%s) - %s",0x885b,(ulong)*puVar9,"mmap",pcVar19,
                      "");
        }
        else {
LAB_0012520a:
          if (0 < (int)local_d8) {
            uVar12 = (ulong)*(ushort *)(lVar1 + 0x20);
            uVar14 = uVar15;
            do {
              *(void **)(*(long *)(lVar1 + 0x28) + uVar12 * 8) = pvVar11;
              uVar12 = uVar12 + 1;
              pvVar11 = (void *)((long)pvVar11 + uVar16);
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
          }
          *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + (short)local_d8;
          bVar20 = true;
        }
      }
    } while (bVar20);
  }
LAB_00125274:
  if ((int)local_d0 < (int)(uint)*(ushort *)(lVar1 + 0x20)) {
    pvVar11 = *(void **)(*(long *)(lVar1 + 0x28) + (long)(int)local_d0 * 8);
  }
  else {
    pvVar11 = (void *)0x0;
  }
  *pp = pvVar11;
  iVar17 = 8;
  if (iVar5 != 0) {
    iVar17 = iVar5;
  }
  if (*(char *)(lVar1 + 0x22) == '\0') {
    iVar17 = iVar5;
  }
  if (*(sqlite3_mutex **)(lVar1 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar1 + 8));
  }
  return iVar17;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;
  int nShmPerMap = unixShmRegionPerMap();
  int nReqRegion;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->mutex);
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->h>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->h<0 || pDbFd->pInode->bProcessLock==0 );

  /* Minimum number of regions required to be mapped. */
  nReqRegion = ((iRegion+nShmPerMap) / nShmPerMap) * nShmPerMap;

  if( pShmNode->nRegion<nReqRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = nReqRegion*szRegion;   /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->h>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->h, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }
  
      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            int x = 0;
            if( seekAndWriteFd(pShmNode->h, iPg*pgsz + pgsz-1, "", 1, &x)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, nReqRegion*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM_BKPT;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while( pShmNode->nRegion<nReqRegion ){
      int nMap = szRegion*nShmPerMap;
      int i;
      void *pMem;
      if( pShmNode->h>=0 ){
        pMem = osMmap(0, nMap,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE, 
            MAP_SHARED, pShmNode->h, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc64(szRegion);
        if( pMem==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto shmpage_out;
        }
        memset(pMem, 0, szRegion);
      }

      for(i=0; i<nShmPerMap; i++){
        pShmNode->apRegion[pShmNode->nRegion+i] = &((char*)pMem)[szRegion*i];
      }
      pShmNode->nRegion += nShmPerMap;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->mutex);
  return rc;
}